

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O3

void __thiscall jrtplib::RTCPCompoundPacketBuilder::SDESSource::~SDESSource(SDESSource *this)

{
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  *this_00;
  _List_node_base *p_Var1;
  RTPMemoryManager *pRVar2;
  _List_node_base *p_Var3;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__SDESSource_0013c900;
  this_00 = &this->items;
  for (p_Var1 = (this->items).
                super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)this_00
      ; p_Var1 = p_Var1->_M_next) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      pRVar2 = (this->super_RTPMemoryObject).mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        operator_delete__(p_Var1[1]._M_next);
      }
      else {
        (**(code **)(*(long *)pRVar2 + 0x18))();
      }
    }
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(this_00);
  p_Var1 = (this_00->
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var1 != (_List_node_base *)this_00) {
    p_Var3 = p_Var1->_M_next;
    operator_delete(p_Var1,0x20);
    p_Var1 = p_Var3;
  }
  return;
}

Assistant:

~SDESSource()
		{
			std::list<Buffer>::const_iterator it;
			for (it = items.begin() ; it != items.end() ; it++)
			{
				if ((*it).packetdata)
					RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
			}
			items.clear();
		}